

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O2

int __thiscall
CVmObjHTTPRequest::getp_setCookie
          (CVmObjHTTPRequest *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  undefined8 *puVar1;
  int iVar2;
  ushort *puVar3;
  ushort *puVar4;
  char *pcVar5;
  size_t sVar6;
  vm_httpreq_cookie *this_00;
  char *pcVar7;
  ulong namelen;
  undefined4 in_register_00000034;
  ulong len;
  long lVar8;
  long *plVar9;
  size_t vdomlen;
  size_t vpathlen;
  char *vdom;
  char *vpath;
  char *cdom;
  size_t cdomlen;
  size_t cpathlen;
  char *cpath;
  
  if (oargc == (uint *)0x0) {
    lVar8 = 0;
  }
  else {
    lVar8 = (long)(int)*oargc;
  }
  if (getp_setCookie(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar2 = __cxa_guard_acquire(&getp_setCookie(unsigned_int,vm_val_t*,unsigned_int*)::desc,
                                CONCAT44(in_register_00000034,self));
    if (iVar2 != 0) {
      getp_setCookie::desc.min_argc_ = 2;
      getp_setCookie::desc.opt_argc_ = 0;
      getp_setCookie::desc.varargs_ = 0;
      __cxa_guard_release(&getp_setCookie(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,oargc,&getp_setCookie::desc);
  if (iVar2 == 0) {
    puVar3 = (ushort *)vm_val_t::get_as_string(sp_ + -1);
    puVar4 = (ushort *)vm_val_t::get_as_string(sp_ + -2);
    if ((puVar3 == (ushort *)0x0) || (puVar4 == (ushort *)0x0)) {
      err_throw(0x900);
    }
    namelen = (ulong)*puVar3;
    len = (ulong)*puVar4;
    puVar4 = puVar4 + 1;
    pcVar5 = lib_copy_str((char *)puVar4,len);
    parse_attr_token(pcVar5,"path",&cpath,&cpathlen);
    parse_attr_token(pcVar5,"domain",&cdom,&cdomlen);
    plVar9 = (long *)((this->super_CVmObject).ext_ + 8);
    while (puVar1 = (undefined8 *)*plVar9, puVar1 != (undefined8 *)0x0) {
      pcVar7 = (char *)*puVar1;
      sVar6 = strlen(pcVar7);
      if (sVar6 == namelen) {
        iVar2 = bcmp(pcVar7,puVar3 + 1,namelen);
        if (iVar2 == 0) {
          parse_attr_token((char *)puVar1[1],"path",&vpath,&vpathlen);
          parse_attr_token((char *)puVar1[1],"domain",&vdom,&vdomlen);
          iVar2 = match_attrs(vpath,vpathlen,cpath,cpathlen);
          if (iVar2 != 0) {
            iVar2 = match_attrs(vdom,vdomlen,cdom,cdomlen);
            if (iVar2 != 0) {
              lib_free_str((char *)puVar1[1]);
              pcVar7 = lib_copy_str((char *)puVar4,len);
              puVar1[1] = pcVar7;
              lib_free_str(pcVar5);
              goto LAB_002058fa;
            }
          }
        }
      }
      plVar9 = puVar1 + 2;
    }
    lib_free_str(pcVar5);
    this_00 = (vm_httpreq_cookie *)operator_new(0x18);
    vm_httpreq_cookie::vm_httpreq_cookie(this_00,(char *)(puVar3 + 1),namelen,(char *)puVar4,len);
    pcVar5 = (this->super_CVmObject).ext_;
    this_00->nxt = *(vm_httpreq_cookie **)(pcVar5 + 8);
    *(vm_httpreq_cookie **)(pcVar5 + 8) = this_00;
LAB_002058fa:
    sp_ = sp_ + -lVar8;
    retval->typ = VM_NIL;
  }
  return 1;
}

Assistant:

int CVmObjHTTPRequest::getp_setCookie(VMG_ vm_obj_id_t self,
                                      vm_val_t *retval, uint *oargc)
{
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(2);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the cookie name and value */
    const char *cname = G_stk->get(0)->get_as_string(vmg0_);
    const char *cval = G_stk->get(1)->get_as_string(vmg0_);

    /* check that we got string values */
    if (cname == 0 || cval == 0)
        err_throw(VMERR_BAD_TYPE_BIF);

    /* get the name and value length and buffer */
    size_t cname_len = vmb_get_len(cname), cval_len = vmb_get_len(cval);
    cname += VMB_LEN;
    cval += VMB_LEN;

    /* get a null-terminated copy of the value, and parse out the 'path' */
    char *cbuf = lib_copy_str(cval, cval_len);
    const char *cpath, *cdom;
    size_t cpathlen, cdomlen;
    parse_attr_token(cbuf, "path", cpath, cpathlen);
    parse_attr_token(cbuf, "domain", cdom, cdomlen);

    /* search for an existing cookie with this name */
    vm_httpreq_cookie *cookie;
    for (cookie = get_ext()->cookies ; cookie != 0 ; cookie = cookie->nxt)
    {
        /* check for a match */
        if (strlen(cookie->name) == cname_len
            && memcmp(cookie->name, cname, cname_len) == 0)
        {
            /* parse the current value's path and domain attributes */
            const char *vpath, *vdom;
            size_t vpathlen, vdomlen;
            parse_attr_token(cookie->val, "path", vpath, vpathlen);
            parse_attr_token(cookie->val, "domain", vdom, vdomlen);

            /*   
             *   Check to see if the path and domain match.  If not, this
             *   counts as a distinct cookie.  
             */
            if (!match_attrs(vpath, vpathlen, cpath, cpathlen)
                || !match_attrs(vdom, vdomlen, cdom, cdomlen))
                continue;

            /* it's already defined - redefine it with the new value */
            lib_free_str(cookie->val);
            cookie->val = lib_copy_str(cval, cval_len);
            break;
        }
    }

    /* done with the allocated value copy */
    lib_free_str(cbuf);

    /* if we didn't replace an existing entry, create a new one */
    if (cookie == 0)
    {
        /* create the entry */
        cookie = new vm_httpreq_cookie(cname, cname_len, cval, cval_len);

        /* link it into our list */
        cookie->nxt = get_ext()->cookies;
        get_ext()->cookies = cookie;
    }

    /* done with the arguments */
    G_stk->discard(argc);

    /* no return value */
    retval->set_nil();

    /* handled */
    return TRUE;
}